

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall Net::makeconnect(Net *this,string *ip)

{
  char *host_port;
  BIO *pBVar1;
  ostream *this_00;
  long lVar2;
  string *ip_local;
  Net *this_local;
  
  std::__cxx11::string::operator+=((string *)ip,":45451");
  host_port = (char *)std::__cxx11::string::c_str();
  pBVar1 = BIO_new_connect(host_port);
  this->sock = (BIO *)pBVar1;
  if (this->sock == (BIO *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"bio error");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  else {
    lVar2 = BIO_ctrl((BIO *)this->sock,0x65,0,(void *)0x0);
    if (lVar2 < 1) {
      std::operator<<((ostream *)&std::cout,"bio error:");
      ERR_print_errors_fp(_stdout);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      this->closed = 1;
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Net::makeconnect(std::string ip){
	ip+=":45451";
	sock=BIO_new_connect(ip.c_str());
	if(sock==NULL){
		std::cout<<"bio error"<<std::endl;
		return -1;
	}

	if(BIO_do_connect(sock)<=0){
		std::cout<<"bio error:";
		ERR_print_errors_fp(stdout);
		std::cout<<std::endl;
		closed=1;
		return -1;
	}
	return 0;
}